

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

double __thiscall
soplex::SPxScaler<double>::getCoefUnscaled
          (SPxScaler<double> *this,SPxLPBase<double> *lp,int row,int col)

{
  DataArray<int> *this_00;
  int *piVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  double x;
  Real RVar2;
  DataArray<int> *colscaleExp;
  DataArray<int> *rowscaleExp;
  int in_stack_ffffffffffffffcc;
  int exp;
  SPxLPBase<double> *in_stack_ffffffffffffffd0;
  
  this_00 = (DataArray<int> *)(in_RSI + 0x178);
  SPxLPBase<double>::colVector(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  x = SVectorBase<double>::operator[]
                ((SVectorBase<double> *)this_00,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  piVar1 = DataArray<int>::operator[]((DataArray<int> *)(in_RSI + 0xb0),in_EDX);
  exp = -*piVar1;
  DataArray<int>::operator[](this_00,in_ECX);
  RVar2 = spxLdexp(x,exp);
  return RVar2;
}

Assistant:

R SPxScaler<R>::getCoefUnscaled(const SPxLPBase<R>& lp, int row, int col) const
{
   assert(lp.isScaled());
   assert(row < lp.nRows());
   assert(col < lp.nCols());

   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;
   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;

   return spxLdexp(lp.colVector(col)[row], - rowscaleExp[row] - colscaleExp[col]);
}